

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_mesh_vbuf.cxx
# Opt level: O0

void __thiscall xray_re::xr_mesh_vbuf::reserve(xr_mesh_vbuf *this,size_t reserved)

{
  bool bVar1;
  size_t sVar2;
  size_t reserved_local;
  xr_mesh_vbuf *this_local;
  
  sVar2 = xr_flexbuf::size((xr_flexbuf *)this);
  if (sVar2 < reserved) {
    bVar1 = xr_vbuf::has_points(&this->super_xr_vbuf);
    if (bVar1) {
      extend<xray_re::_vector3<float>>(this,&(this->super_xr_vbuf).m_points,reserved);
    }
    bVar1 = xr_vbuf::has_normals(&this->super_xr_vbuf);
    if (bVar1) {
      extend<xray_re::_vector3<float>>(this,&(this->super_xr_vbuf).m_normals,reserved);
    }
    bVar1 = xr_vbuf::has_texcoords(&this->super_xr_vbuf);
    if (bVar1) {
      extend<xray_re::_vector2<float>>(this,&(this->super_xr_vbuf).m_texcoords,reserved);
    }
    bVar1 = xr_vbuf::has_influences(&this->super_xr_vbuf);
    if (bVar1) {
      extend<xray_re::_influence<unsigned_int,float>>
                (this,&(this->super_xr_vbuf).m_influences,reserved);
    }
    bVar1 = xr_vbuf::has_colors(&this->super_xr_vbuf);
    if (bVar1) {
      extend<xray_re::_color<float>>(this,&(this->super_xr_vbuf).m_colors,reserved);
    }
    this->m_reserved = reserved;
  }
  return;
}

Assistant:

void xr_mesh_vbuf::reserve(size_t reserved)
{
	if (reserved <= size())
		return;
	if (has_points())
		extend(m_points, reserved);
	if (has_normals())
		extend(m_normals, reserved);
	if (has_texcoords())
		extend(m_texcoords, reserved);
	if (has_influences())
		extend(m_influences, reserved);
	if (has_colors())
		extend(m_colors, reserved);
	m_reserved = reserved;
}